

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O1

void __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::get_pointers
          (heterogeneous_queue<libtorrent::alert> *this,
          vector<libtorrent::alert_*,_std::allocator<libtorrent::alert_*>_> *out)

{
  ushort uVar1;
  _Head_base<0UL,_char_*,_false> _Var2;
  ushort *puVar3;
  alert *local_30;
  
  if (*(long *)(out + 8) != *(long *)out) {
    *(long *)(out + 8) = *(long *)out;
  }
  if (0 < (long)this->m_size) {
    _Var2._M_head_impl =
         (this->m_storage)._M_t.super___uniq_ptr_impl<char,_libtorrent::aux::free_deleter>._M_t.
         super__Tuple_impl<0UL,_char_*,_libtorrent::aux::free_deleter>.
         super__Head_base<0UL,_char_*,_false>._M_head_impl;
    puVar3 = (ushort *)(_Var2._M_head_impl + this->m_size);
    do {
      uVar1 = *(ushort *)((long)_Var2._M_head_impl + 2);
      local_30 = (alert *)((long)_Var2._M_head_impl + (ulong)(byte)uVar1 + 0x10);
      ::std::vector<libtorrent::alert*,std::allocator<libtorrent::alert*>>::
      emplace_back<libtorrent::alert*>
                ((vector<libtorrent::alert*,std::allocator<libtorrent::alert*>> *)out,&local_30);
      _Var2._M_head_impl =
           _Var2._M_head_impl + (ulong)*(ushort *)_Var2._M_head_impl + (ulong)(byte)uVar1 + 0x10;
    } while (_Var2._M_head_impl < puVar3);
  }
  return;
}

Assistant:

void get_pointers(std::vector<T*>& out)
		{
			out.clear();

			char* ptr = m_storage.get();
			char const* const end = m_storage.get() + m_size;
			while (ptr < end)
			{
				header_t* hdr = reinterpret_cast<header_t*>(ptr);
				ptr += sizeof(header_t) + hdr->pad_bytes;
				TORRENT_ASSERT(ptr + hdr->len <= end);
				out.push_back(reinterpret_cast<T*>(ptr));
				ptr += hdr->len;
			}
		}